

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  byte *pbVar10;
  BYTE *pBVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  byte *pbVar19;
  BYTE *pBVar20;
  U32 *pUVar21;
  uint uVar22;
  uint uVar23;
  ulong *puVar24;
  U32 *pUVar25;
  uint *puVar26;
  uint uVar27;
  U32 *pUVar28;
  ulong *puVar29;
  uint uVar30;
  uint uVar31;
  ulong *puVar32;
  ulong *puVar33;
  uint uVar34;
  U32 UVar35;
  uint uVar36;
  U32 UVar37;
  ulong uVar38;
  byte *pbVar39;
  BYTE *pBVar40;
  BYTE *pInLoopLimit_1;
  uint uVar41;
  uint uVar42;
  ulong *puVar43;
  bool bVar44;
  BYTE *pInLoopLimit;
  U32 dummy32;
  byte *local_118;
  byte *local_110;
  U32 *local_f8;
  ulong local_f0;
  U32 *local_d8;
  ulong local_a8;
  U32 local_60;
  U32 local_5c;
  U32 *local_58;
  ulong local_50;
  U32 *local_48;
  BYTE *local_40;
  ulong *local_38;
  
  local_50 = (ulong)(mls - 5);
  cVar15 = (char)(ms->cParams).hashLog;
  switch(local_50) {
  case 0:
    lVar8 = -0x30e4432345000000;
    break;
  case 1:
    lVar8 = -0x30e4432340650000;
    break;
  case 2:
    lVar8 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar7 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_0016dd93;
  default:
    uVar7 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar15 & 0x1fU));
    goto LAB_0016dd98;
  }
  uVar7 = lVar8 * *(long *)ip;
LAB_0016dd93:
  uVar7 = uVar7 >> (-cVar15 & 0x3fU);
LAB_0016dd98:
  pBVar1 = (ms->window).base;
  uVar34 = (int)ip - (int)pBVar1;
  uVar6 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar35 = (ms->window).lowLimit;
  UVar37 = uVar34 - uVar6;
  if (uVar34 - UVar35 <= uVar6) {
    UVar37 = UVar35;
  }
  if (ms->loadedDictEnd != 0) {
    UVar37 = UVar35;
  }
  uVar6 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar16 = uVar34 - uVar6;
  if (uVar34 < uVar6) {
    uVar16 = 0;
  }
  uVar31 = UVar37;
  if (UVar37 < uVar16) {
    uVar31 = uVar16;
  }
  uVar41 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3fdb,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_48 = ms->hashTable;
  pUVar28 = ms->chainTable;
  uVar17 = local_48[uVar7];
  uVar38 = 0;
  uVar42 = uVar41;
  if (uVar31 < uVar17) {
    uVar14 = 0;
    do {
      uVar38 = (ulong)uVar17;
      uVar12 = (ulong)((uVar17 & uVar6) * 2);
      if ((pUVar28[uVar12 + 1] != 1) || (uVar42 < 2)) {
        uVar38 = uVar14;
        if (pUVar28[uVar12 + 1] == 1) {
          (pUVar28 + uVar12)[0] = 0;
          (pUVar28 + uVar12)[1] = 0;
        }
        break;
      }
      pUVar28[uVar12 + 1] = (U32)uVar14;
      uVar42 = uVar42 - 1;
      uVar17 = pUVar28[uVar12];
      uVar14 = uVar38;
    } while (uVar31 < uVar17);
  }
  local_58 = pUVar28;
  if ((int)uVar38 != 0) {
    pBVar2 = (ms->window).dictBase;
    do {
      uVar17 = (ms->window).dictLimit;
      pbVar19 = (byte *)(ulong)uVar17;
      local_38 = (ulong *)(pBVar2 + (long)pbVar19);
      uVar27 = (uint)uVar38;
      puVar43 = (ulong *)iend;
      pBVar20 = pBVar1;
      if (uVar27 < uVar17) {
        puVar43 = local_38;
        pBVar20 = pBVar2;
      }
      uVar36 = (ms->window).lowLimit;
      uVar22 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar23 = uVar27 - uVar22;
      if (uVar27 - uVar36 <= uVar22) {
        uVar23 = uVar36;
      }
      if (uVar27 < uVar31) {
        __assert_fail("current >= btLow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3f34,
                      "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      puVar29 = (ulong *)(pBVar20 + uVar38);
      if (puVar43 <= puVar29) {
        __assert_fail("ip < iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3f35,
                      "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      uVar36 = pUVar28[(ulong)((uVar27 & uVar6) * 2) + 1];
      uVar30 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      local_40 = pBVar1 + (long)pbVar19;
      local_d8 = pUVar28 + (uVar27 & uVar30) * 2;
      UVar35 = *local_d8;
      local_f8 = local_d8 + 1;
      local_110 = (byte *)0x0;
      local_118 = (byte *)0x0;
      uVar22 = uVar42;
      do {
        bVar44 = uVar22 == 0;
        uVar22 = uVar22 - 1;
        if ((bVar44) || (UVar35 <= uVar23)) break;
        pbVar10 = local_110;
        if (local_118 < local_110) {
          pbVar10 = local_118;
        }
        if (uVar27 <= UVar35) {
          __assert_fail("matchIndex < current",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3f3a,
                        "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                       );
        }
        pBVar20 = pBVar1;
        if (dictMode == ZSTD_extDict) {
          if ((uVar27 < uVar17) || (pbVar19 <= pbVar10 + UVar35)) {
            if (pbVar10 + UVar35 < pbVar19) {
              pBVar20 = pBVar2;
            }
            goto LAB_0016e092;
          }
          sVar9 = ZSTD_count_2segments
                            ((byte *)((long)puVar29 + (long)pbVar10),pBVar2 + UVar35 + (long)pbVar10
                             ,(BYTE *)puVar43,(BYTE *)local_38,local_40);
          pbVar10 = pbVar10 + sVar9;
          pBVar20 = pBVar1 + UVar35;
          pUVar28 = local_58;
          if (pbVar10 + UVar35 < pbVar19) {
            pBVar20 = pBVar2 + UVar35;
          }
        }
        else {
LAB_0016e092:
          if ((uVar17 <= uVar27) && (pbVar10 + UVar35 < pbVar19)) {
            __assert_fail("(matchIndex+matchLength >= dictLimit) || (current < dictLimit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3f46,
                          "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                         );
          }
          puVar24 = (ulong *)((long)puVar29 + (long)pbVar10);
          puVar32 = (ulong *)(pBVar20 + UVar35 + (long)pbVar10);
          puVar33 = puVar24;
          if (puVar24 < (ulong *)((long)puVar43 - 7U)) {
            uVar14 = *puVar24 ^ *puVar32;
            uVar38 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
              }
            }
            pbVar39 = (byte *)(uVar38 >> 3 & 0x1fffffff);
            if (*puVar32 == *puVar24) {
              do {
                puVar33 = puVar33 + 1;
                puVar32 = puVar32 + 1;
                if ((ulong *)((long)puVar43 - 7U) <= puVar33) goto LAB_0016e11a;
                uVar14 = *puVar33 ^ *puVar32;
                uVar38 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                pbVar39 = (byte *)((long)puVar33 + ((uVar38 >> 3 & 0x1fffffff) - (long)puVar24));
              } while (*puVar32 == *puVar33);
            }
          }
          else {
LAB_0016e11a:
            if ((puVar33 < (ulong *)((long)puVar43 - 3U)) && ((int)*puVar32 == (int)*puVar33)) {
              puVar33 = (ulong *)((long)puVar33 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar33 < (ulong *)((long)puVar43 - 1U)) && ((short)*puVar32 == (short)*puVar33)) {
              puVar33 = (ulong *)((long)puVar33 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar33 < puVar43) {
              puVar33 = (ulong *)((long)puVar33 + (ulong)((byte)*puVar32 == (byte)*puVar33));
            }
            pbVar39 = (byte *)((long)puVar33 - (long)puVar24);
          }
          pbVar10 = pbVar39 + (long)pbVar10;
          pBVar20 = pBVar20 + UVar35;
        }
        if ((ulong *)(pbVar10 + (long)puVar29) == puVar43) {
          bVar44 = false;
        }
        else {
          pUVar25 = pUVar28 + (UVar35 & uVar30) * 2;
          if (pBVar20[(long)pbVar10] < (byte)*(ulong *)(pbVar10 + (long)puVar29)) {
            *local_d8 = UVar35;
            local_118 = pbVar10;
            if (uVar31 < UVar35) {
              pUVar25 = pUVar25 + 1;
              local_d8 = pUVar25;
LAB_0016e1df:
              UVar35 = *pUVar25;
              bVar44 = true;
            }
            else {
              bVar44 = false;
              local_d8 = &local_5c;
            }
          }
          else {
            *local_f8 = UVar35;
            local_110 = pbVar10;
            local_f8 = pUVar25;
            if (uVar31 < UVar35) goto LAB_0016e1df;
            bVar44 = false;
            local_f8 = &local_5c;
          }
        }
      } while (bVar44);
      *local_f8 = 0;
      *local_d8 = 0;
      uVar42 = uVar42 + 1;
      uVar38 = (ulong)uVar36;
    } while (uVar36 != 0);
  }
  pBVar2 = (ms->window).dictBase;
  uVar14 = (ulong)(ms->window).dictLimit;
  uVar38 = (ulong)((uVar6 & uVar34) * 2);
  pUVar25 = pUVar28 + uVar38;
  pUVar28 = pUVar28 + uVar38 + 1;
  uVar31 = uVar34 + 9;
  UVar35 = local_48[uVar7];
  local_48[uVar7] = uVar34;
  local_110 = (byte *)0x0;
  local_118 = (byte *)0x0;
  uVar7 = 0;
  do {
    bVar44 = uVar41 == 0;
    uVar41 = uVar41 - 1;
    if ((bVar44) || (UVar35 <= UVar37)) break;
    pbVar19 = local_118;
    if (local_110 < local_118) {
      pbVar19 = local_110;
    }
    uVar38 = (ulong)UVar35;
    if ((dictMode == ZSTD_extDict) && ((long)pbVar19 + uVar38 < uVar14)) {
      pBVar11 = pBVar2 + uVar38;
      sVar9 = ZSTD_count_2segments
                        (ip + (long)pbVar19,pBVar11 + (long)pbVar19,iend,pBVar2 + uVar14,
                         pBVar1 + uVar14);
      uVar12 = sVar9 + (long)pbVar19;
      pBVar20 = pBVar1 + uVar38;
      if (uVar12 + uVar38 < uVar14) {
        pBVar20 = pBVar11;
      }
    }
    else {
      puVar43 = (ulong *)(ip + (long)pbVar19);
      puVar29 = (ulong *)(pBVar1 + uVar38 + (long)pbVar19);
      puVar32 = puVar43;
      if (puVar43 < iend + -7) {
        uVar13 = *puVar43 ^ *puVar29;
        uVar12 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar12 = uVar12 >> 3 & 0x1fffffff;
        if (*puVar29 == *puVar43) {
          do {
            puVar32 = puVar32 + 1;
            puVar29 = puVar29 + 1;
            if (iend + -7 <= puVar32) goto LAB_0016e423;
            uVar13 = *puVar32 ^ *puVar29;
            uVar12 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar12 = (long)puVar32 + ((uVar12 >> 3 & 0x1fffffff) - (long)puVar43);
          } while (*puVar29 == *puVar32);
        }
      }
      else {
LAB_0016e423:
        if ((puVar32 < iend + -3) && ((int)*puVar29 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar29 = (ulong *)((long)puVar29 + 4);
        }
        if ((puVar32 < iend + -1) && ((short)*puVar29 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar29 = (ulong *)((long)puVar29 + 2);
        }
        if (puVar32 < iend) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar29 == (char)*puVar32));
        }
        uVar12 = (long)puVar32 - (long)puVar43;
      }
      uVar12 = uVar12 + (long)pbVar19;
      pBVar20 = pBVar1 + uVar38;
    }
    if (uVar7 < uVar12) {
      uVar17 = UVar35 + (int)uVar12;
      if (uVar12 <= uVar31 - UVar35) {
        uVar17 = uVar31;
      }
      uVar31 = (uVar34 - UVar35) + 1;
      if ((uVar31 == 0) || (uVar42 = (int)*offsetPtr + 1, uVar42 == 0)) goto LAB_0016e8d7;
      iVar18 = 0x1f;
      if (uVar31 != 0) {
        for (; uVar31 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      iVar4 = 0x1f;
      if (uVar42 != 0) {
        for (; uVar42 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      if (iVar18 - iVar4 < ((int)uVar12 - (int)uVar7) * 4) {
        *offsetPtr = (ulong)((uVar34 + 2) - UVar35);
        uVar7 = uVar12;
      }
      uVar31 = uVar17;
      if (ip + uVar12 != iend) goto LAB_0016e507;
      bVar44 = false;
      if (dictMode == ZSTD_dictMatchState) {
        uVar41 = 0;
      }
    }
    else {
LAB_0016e507:
      pUVar21 = local_58 + (UVar35 & uVar6) * 2;
      if (pBVar20[uVar12] < ip[uVar12]) {
        *pUVar25 = UVar35;
        local_110 = (byte *)uVar12;
        if (uVar16 < UVar35) {
          pUVar21 = pUVar21 + 1;
          pUVar25 = pUVar21;
LAB_0016e55d:
          UVar35 = *pUVar21;
          bVar44 = true;
        }
        else {
          bVar44 = false;
          pUVar25 = &local_60;
        }
      }
      else {
        *pUVar28 = UVar35;
        pUVar28 = pUVar21;
        local_118 = (byte *)uVar12;
        if (uVar16 < UVar35) goto LAB_0016e55d;
        bVar44 = false;
        pUVar28 = &local_60;
      }
    }
  } while (bVar44);
  *pUVar28 = 0;
  *pUVar25 = 0;
  if ((dictMode == ZSTD_dictMatchState) && (uVar41 != 0)) {
    pZVar3 = ms->dictMatchState;
    if ((uint)local_50 < 4) {
      sVar9 = (*(code *)(&DAT_0019f3e8 + *(int *)(&DAT_0019f3e8 + local_50 * 4)))
                        (&DAT_0019f3e8 + *(int *)(&DAT_0019f3e8 + local_50 * 4));
      return sVar9;
    }
    uVar6 = pZVar3->hashTable
            [(uint)(*(int *)ip * -0x61c8864f) >> (-(char)(pZVar3->cParams).hashLog & 0x1fU)];
    uVar16 = (ms->window).dictLimit;
    pBVar2 = (pZVar3->window).nextSrc;
    pBVar20 = (pZVar3->window).base;
    uVar38 = (long)pBVar2 - (long)pBVar20;
    uVar17 = (pZVar3->window).lowLimit;
    iVar18 = (int)uVar38;
    uVar36 = (ms->window).lowLimit - iVar18;
    uVar27 = ~(-1 << ((char)(pZVar3->cParams).chainLog - 1U & 0x1f));
    uVar42 = iVar18 - uVar27;
    if (iVar18 - uVar17 <= uVar27) {
      uVar42 = uVar17;
    }
    pUVar28 = pZVar3->chainTable;
    local_a8 = 0;
    local_f0 = 0;
    do {
      bVar44 = uVar41 == 0;
      uVar41 = uVar41 - 1;
      if ((bVar44) || (uVar6 <= uVar17)) break;
      uVar14 = local_f0;
      if (local_a8 < local_f0) {
        uVar14 = local_a8;
      }
      uVar12 = (ulong)uVar6;
      pBVar11 = pBVar20 + uVar12;
      sVar9 = ZSTD_count_2segments(ip + uVar14,pBVar11 + uVar14,iend,pBVar2,pBVar1 + uVar16);
      uVar14 = sVar9 + uVar14;
      pBVar40 = pBVar1 + uVar12 + uVar36;
      if (uVar14 + uVar12 < (uVar38 & 0xffffffff)) {
        pBVar40 = pBVar11;
      }
      if (uVar7 < uVar14) {
        iVar18 = uVar36 + uVar6;
        uVar23 = (uVar34 - iVar18) + 1;
        if ((uVar23 == 0) || (uVar22 = (int)*offsetPtr + 1, uVar22 == 0)) {
LAB_0016e8d7:
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x12c2,"U32 ZSTD_highbit32(U32)");
        }
        iVar4 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        iVar5 = 0x1f;
        if (uVar22 != 0) {
          for (; uVar22 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        if (iVar4 - iVar5 < ((int)uVar14 - (int)uVar7) * 4) {
          *offsetPtr = (ulong)((uVar34 + 2) - iVar18);
          uVar7 = uVar14;
        }
        if (ip + uVar14 != iend) goto LAB_0016e7ee;
        cVar15 = (ip + uVar14 == iend) * '\x03';
      }
      else {
LAB_0016e7ee:
        puVar26 = pUVar28 + (uVar6 & uVar27) * 2;
        if (pBVar40[uVar14] < ip[uVar14]) {
          cVar15 = '\x03';
          if (uVar42 < uVar6) {
            puVar26 = puVar26 + 1;
            uVar12 = local_f0;
            local_a8 = uVar14;
LAB_0016e83c:
            uVar6 = *puVar26;
            cVar15 = '\0';
            local_f0 = uVar12;
          }
        }
        else {
          cVar15 = '\x03';
          uVar12 = uVar14;
          if (uVar42 < uVar6) goto LAB_0016e83c;
        }
      }
    } while (cVar15 == '\0');
  }
  if (uVar31 <= uVar34 + 8) {
    __assert_fail("matchEndIdx > current+8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4045,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar31 - 8;
  return uVar7;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, current, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}